

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator_factory.cc
# Opt level: O3

ExtensionGenerator * __thiscall
google::protobuf::compiler::java::ImmutableGeneratorFactory::NewExtensionGenerator
          (ImmutableGeneratorFactory *this,FieldDescriptor *descriptor)

{
  Context *context;
  ImmutableExtensionLiteGenerator *this_00;
  
  context = this->context_;
  if (((context->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(descriptor + 0x30) + 0xa0) + 0xa8) != 3)) {
    this_00 = (ImmutableExtensionLiteGenerator *)operator_new(0x40);
    ImmutableExtensionGenerator::ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)this_00,descriptor,context);
  }
  else {
    this_00 = (ImmutableExtensionLiteGenerator *)operator_new(0x40);
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator(this_00,descriptor,context);
  }
  return &this_00->super_ExtensionGenerator;
}

Assistant:

ExtensionGenerator* ImmutableGeneratorFactory::NewExtensionGenerator(
    const FieldDescriptor* descriptor) const {
  if (HasDescriptorMethods(descriptor->file(), context_->EnforceLite())) {
    return new ImmutableExtensionGenerator(descriptor, context_);
  } else {
    return new ImmutableExtensionLiteGenerator(descriptor, context_);
  }
}